

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_oid(uchar **p,uchar *start,char *oid,size_t oid_len)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  
  puVar1 = *p;
  uVar2 = 0xffffff94;
  if (oid_len <= (ulong)((long)puVar1 - (long)start) && start <= puVar1) {
    *p = puVar1 + -oid_len;
    memcpy(puVar1 + -oid_len,oid,oid_len);
    uVar2 = (uint)oid_len;
  }
  if (-1 < (int)uVar2) {
    iVar3 = mbedtls_asn1_write_len_and_tag(p,start,(ulong)uVar2,'\x06');
    return iVar3;
  }
  return uVar2;
}

Assistant:

int mbedtls_asn1_write_oid(unsigned char **p, const unsigned char *start,
                           const char *oid, size_t oid_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start,
                                                            (const unsigned char *) oid, oid_len));
    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_OID);
}